

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftbsdf.c
# Opt level: O3

FT_Error bsdf_approximate_edge(BSDF_Worker *worker)

{
  ulong uVar1;
  ED *pEVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  FT_Error FVar6;
  FT_Long FVar7;
  long lVar8;
  FT_Fixed FVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  ED *pEVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  FT_Vector *vec;
  int iVar21;
  ulong uVar22;
  int iVar23;
  FT_Vector local_50;
  FT_Byte *local_40;
  FT_Byte *local_38;
  
  FVar6 = 6;
  if ((worker != (BSDF_Worker *)0x0) && (pEVar2 = worker->distance_map, pEVar2 != (ED *)0x0)) {
    iVar10 = worker->rows;
    if (0 < iVar10) {
      local_38 = &pEVar2[-1].alpha;
      local_40 = &pEVar2[1].alpha;
      uVar4 = worker->width;
      iVar14 = 0;
      do {
        if (0 < (int)uVar4) {
          iVar10 = iVar14 + 1;
          iVar23 = 0;
          do {
            pEVar17 = worker->distance_map;
            lVar12 = (long)(int)(uVar4 * iVar14 + iVar23);
            if (pEVar17[lVar12].alpha == '\0') {
LAB_0023d14b:
              pEVar2[lVar12].dist = 0x1900000;
              pEVar2[lVar12].prox.x = 0xc80000;
              pEVar2[lVar12].prox.y = 0xc80000;
            }
            else {
              iVar18 = worker->rows;
              if (pEVar17[lVar12].alpha == 0xff) {
                iVar20 = 0;
                if ((iVar14 <= iVar18 && iVar14 != 0) &&
                   (iVar20 = 1, pEVar17[lVar12 + (int)-uVar4].alpha == '\0')) goto LAB_0023d168;
                if (iVar10 < iVar18) {
                  if (pEVar17[lVar12 + (ulong)uVar4].alpha == '\0') goto LAB_0023d168;
                  iVar20 = iVar20 + 1;
                }
                if (iVar18 <= iVar14 || iVar23 == 0) {
LAB_0023d087:
                  iVar21 = iVar23 + 1;
                  if (iVar21 < (int)uVar4 && iVar14 < iVar18) {
                    if (pEVar17[lVar12 + 1].alpha == '\0') goto LAB_0023d168;
                    iVar20 = iVar20 + 1;
                  }
                  if (((iVar14 <= iVar18) && (iVar14 != 0)) && (iVar23 != 0)) {
                    if (pEVar17[lVar12 + (long)(int)-uVar4 + -1].alpha == '\0') goto LAB_0023d3a0;
                    iVar20 = iVar20 + 1;
                  }
                  if (((iVar14 <= iVar18) && (iVar14 != 0)) && (iVar21 < (int)uVar4)) {
                    if (pEVar17[lVar12 + (long)(int)-uVar4 + 1].alpha == '\0') goto LAB_0023d168;
                    iVar20 = iVar20 + 1;
                  }
                  if (iVar10 < iVar18 && iVar23 != 0) {
                    if (pEVar17[lVar12 + ((ulong)uVar4 - 1)].alpha == '\0') goto LAB_0023d3a0;
                    iVar20 = iVar20 + 1;
                  }
                  if (((iVar10 < iVar18 && iVar21 < (int)uVar4) &&
                      (pEVar17[lVar12 + (ulong)uVar4 + 1].alpha != '\0')) && (iVar20 == 7))
                  goto LAB_0023d14b;
                  goto LAB_0023d168;
                }
                if (pEVar17[lVar12 + -1].alpha != '\0') {
                  iVar20 = iVar20 + 1;
                  goto LAB_0023d087;
                }
LAB_0023d3a0:
                vec = &pEVar2[lVar12].prox;
LAB_0023d17d:
                if (((int)(uVar4 - 1) <= iVar23 || iVar14 == 0) || iVar18 + -1 <= iVar14)
                goto LAB_0023d2d6;
                iVar20 = (uint)pEVar2[lVar12 + (int)(1 - uVar4)].alpha * 0x100;
                lVar16 = (ulong)pEVar2[lVar12].alpha * 0x100;
                iVar18 = (uint)pEVar2[lVar12 + (ulong)(uVar4 - 1)].alpha * 0x100;
                lVar8 = (ulong)pEVar2[lVar12 + (ulong)uVar4 + 1].alpha * 0x100;
                local_50.x = (int)(((iVar20 + (uint)pEVar2[lVar12 + (int)~uVar4].alpha * -0x100) -
                                   ((int)((ulong)local_38[lVar12 * 0x20] * 0x16a0900 + 0x8000 >>
                                         0x10) + iVar18)) +
                                  (int)((ulong)local_40[lVar12 * 0x20] * 0x16a0900 + 0x8000 >> 0x10)
                                  ) + lVar8;
                local_50.y = (FT_Pos)(int)((int)((ulong)pEVar2[lVar12 + (ulong)uVar4].alpha *
                                                 0x16a0900 + 0x8000 >> 0x10) + (int)lVar8 +
                                          (iVar18 - (iVar20 + (uint)pEVar2[lVar12 + (int)~uVar4].
                                                                    alpha * 0x100 +
                                                    (int)((ulong)pEVar2[lVar12 + (int)-uVar4].alpha
                                                          * 0x16a0900 + 0x8000 >> 0x10))));
                FT_Vector_NormLen(&local_50);
                uVar4 = (uint)lVar16;
                if (local_50.y == 0 || local_50.x == 0) {
                  iVar18 = 0x8000 - uVar4;
                }
                else {
                  uVar11 = (uint)local_50.x;
                  uVar13 = -uVar11;
                  if (0 < (int)uVar11) {
                    uVar13 = uVar11;
                  }
                  uVar5 = (uint)local_50.y;
                  uVar11 = -uVar5;
                  if (0 < (int)uVar5) {
                    uVar11 = uVar5;
                  }
                  uVar5 = uVar11;
                  if (uVar13 < uVar11) {
                    uVar5 = uVar13;
                  }
                  uVar22 = (ulong)uVar5;
                  uVar5 = uVar11;
                  if (uVar11 < uVar13) {
                    uVar5 = uVar13;
                  }
                  uVar15 = (ulong)uVar5;
                  FVar7 = FT_DivFix(uVar22,uVar15);
                  iVar18 = (int)((ulong)(FVar7 - (FVar7 >> 0x3f)) >> 1);
                  if ((int)uVar4 < iVar18) {
                    uVar22 = (long)(uVar15 * (uVar22 * lVar16 + 0x8000 >> 0x10) * 0x20000 +
                                   0x100000000) >> 0x20 & 0xfffffffffffffffe;
                    lVar8 = 0;
                    uVar15 = 0x40000000;
                    do {
                      uVar1 = lVar8 + uVar15;
                      lVar16 = uVar1 + uVar15;
                      if (uVar22 < uVar1) {
                        lVar16 = lVar8;
                      }
                      uVar19 = 0;
                      if (uVar22 >= uVar1) {
                        uVar19 = uVar1;
                      }
                      uVar22 = (uVar22 - uVar19) * 2;
                      bVar3 = 0x81 < uVar15;
                      lVar8 = lVar16;
                      uVar15 = uVar15 >> 1;
                    } while (bVar3);
                    iVar18 = (uVar11 + uVar13 >> 1) - (int)((ulong)lVar16 >> 8);
                  }
                  else if (uVar4 < 0x10000U - iVar18) {
                    lVar8 = uVar15 * (long)(int)(0x8000 - uVar4);
                    iVar18 = (int)((ulong)(lVar8 + (lVar8 >> 0x3f) + 0x8000) >> 0x10);
                  }
                  else {
                    uVar22 = (long)(uVar15 * (uVar22 * (0x10000 - uVar4) + 0x8000 >> 0x10) * 0x20000
                                   + 0x100000000) >> 0x20 & 0xfffffffffffffffe;
                    lVar8 = 0;
                    uVar15 = 0x40000000;
                    do {
                      uVar1 = lVar8 + uVar15;
                      lVar16 = uVar1 + uVar15;
                      if (uVar22 < uVar1) {
                        lVar16 = lVar8;
                      }
                      uVar19 = 0;
                      if (uVar22 >= uVar1) {
                        uVar19 = uVar1;
                      }
                      uVar22 = (uVar22 - uVar19) * 2;
                      bVar3 = 0x81 < uVar15;
                      lVar8 = lVar16;
                      uVar15 = uVar15 >> 1;
                    } while (bVar3);
                    iVar18 = (int)((ulong)lVar16 >> 8) - (uVar11 + uVar13 >> 1);
                  }
                }
                lVar8 = (long)(int)local_50.x * (long)iVar18;
                lVar8 = (long)(int)((ulong)(lVar8 + 0x8000 + (lVar8 >> 0x3f)) >> 0x10);
                lVar16 = (long)(int)local_50.y * (long)iVar18;
                lVar16 = (long)(int)((ulong)(lVar16 + 0x8000 + (lVar16 >> 0x3f)) >> 0x10);
              }
              else {
LAB_0023d168:
                vec = &pEVar2[lVar12].prox;
                if (iVar23 != 0) goto LAB_0023d17d;
LAB_0023d2d6:
                lVar16 = 0;
                lVar8 = 0;
              }
              pEVar17 = pEVar2 + lVar12;
              (pEVar17->prox).x = lVar8;
              (pEVar17->prox).y = lVar16;
              FVar9 = FT_Vector_Length(vec);
              pEVar17->dist = (FT_16D16)FVar9;
              uVar4 = worker->width;
            }
            iVar23 = iVar23 + 1;
          } while (iVar23 < (int)uVar4);
          iVar10 = worker->rows;
        }
        iVar14 = iVar14 + 1;
      } while (iVar14 < iVar10);
    }
    FVar6 = 0;
  }
  return FVar6;
}

Assistant:

static FT_Error
  bsdf_approximate_edge( BSDF_Worker*  worker )
  {
    FT_Error  error = FT_Err_Ok;
    FT_Int    i, j;
    FT_Int    index;
    ED*       ed;


    if ( !worker || !worker->distance_map )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    ed = worker->distance_map;

    for ( j = 0; j < worker->rows; j++ )
    {
      for ( i = 0; i < worker->width; i++ )
      {
        index = j * worker->width + i;

        if ( bsdf_is_edge( worker->distance_map + index,
                           i, j,
                           worker->width,
                           worker->rows ) )
        {
          /* approximate the edge distance for edge pixels */
          ed[index].prox = compute_edge_distance( ed + index,
                                                  i, j,
                                                  worker->width,
                                                  worker->rows );
          ed[index].dist = VECTOR_LENGTH_16D16( ed[index].prox );
        }
        else
        {
          /* for non-edge pixels assign far away distances */
          ed[index].dist   = 400 * ONE;
          ed[index].prox.x = 200 * ONE;
          ed[index].prox.y = 200 * ONE;
        }
      }
    }

  Exit:
    return error;
  }